

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O2

void * Js::JavascriptExceptionOperators::OP_TryFinallyNoOpt
                 (void *tryAddr,void *finallyAddr,void *frame,size_t spillSize,size_t argsSize,
                 ScriptContext *scriptContext)

{
  void *pvVar1;
  void *pvVar2;
  undefined1 local_68 [8];
  TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack;
  
  tryHandlerAddrOfReturnAddrStack.m_threadContext = (ThreadContext *)finallyAddr;
  ThreadContext::ProbeStack
            (scriptContext->threadContext,spillSize + argsSize + 0x4c00,scriptContext,(PVOID)0x0);
  TryHandlerAddrOfReturnAddrStack::TryHandlerAddrOfReturnAddrStack
            ((TryHandlerAddrOfReturnAddrStack *)local_68,scriptContext,(void *)((long)frame + 8));
  pvVar1 = (void *)amd64_CallWithFakeFrame(tryAddr,frame,spillSize,argsSize,0);
  TryHandlerAddrOfReturnAddrStack::~TryHandlerAddrOfReturnAddrStack
            ((TryHandlerAddrOfReturnAddrStack *)local_68);
  pvVar2 = (void *)amd64_CallWithFakeFrame
                             (tryHandlerAddrOfReturnAddrStack.m_threadContext,frame,spillSize,
                              argsSize,0);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = pvVar1;
  }
  return pvVar2;
}

Assistant:

void * JavascriptExceptionOperators::OP_TryFinallyNoOpt(void * tryAddr, void * finallyAddr, void * frame, size_t spillSize, size_t argsSize, ScriptContext * scriptContext)
    {
        void                      *tryContinuation = nullptr;
        void                      *finallyContinuation = nullptr;
        JavascriptExceptionObject *exception           = nullptr;
        void                      *tryHandlerAddrOfReturnAddr = nullptr;

        PROBE_STACK(scriptContext, Constants::MinStackJitEHBailout + spillSize + argsSize);
        {
            void * addrOfReturnAddr = (void*)((char*)frame + sizeof(char*));
            Js::JavascriptExceptionOperators::TryHandlerAddrOfReturnAddrStack tryHandlerAddrOfReturnAddrStack(scriptContext, addrOfReturnAddr);
            try
            {
                tryContinuation = amd64_CallWithFakeFrame(tryAddr, frame, spillSize, argsSize);
            }
            catch (const Js::JavascriptException& err)
            {
                exception = err.GetAndClear();
                tryHandlerAddrOfReturnAddr = scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr();
            }
        }
        if (exception)
        {
            // Clone static exception object early in case finally block overwrites it
            exception = exception->CloneIfStaticExceptionObject(scriptContext);
#if ENABLE_NATIVE_CODEGEN
            if (exception->GetExceptionContext() && exception->GetExceptionContext()->ThrowingFunction())
            {
                WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr /* start stackwalk from the current frame */, tryHandlerAddrOfReturnAddr);
            }
#endif
        }

        finallyContinuation = amd64_CallWithFakeFrame(finallyAddr, frame, spillSize, argsSize);
        if (finallyContinuation)
        {
            return finallyContinuation;
        }

        if (exception)
        {
#if ENABLE_NATIVE_CODEGEN
            if (scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr() != nullptr)
            {
                WalkStackForCleaningUpInlineeInfo(scriptContext, nullptr, scriptContext->GetThreadContext()->GetTryHandlerAddrOfReturnAddr());
            }
#endif
            JavascriptExceptionOperators::DoThrow(exception, scriptContext);
        }

        return tryContinuation;
    }